

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitArraySet(PrintExpressionContents *this,ArraySet *curr)

{
  ostream *o;
  HeapType type;
  string_view local_28;
  ArraySet *local_18;
  ArraySet *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (ArraySet *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"array.set ");
  printMedium(o,local_28);
  type = wasm::Type::getHeapType(&local_18->ref->type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    printMedium(o, "array.set ");
    printHeapTypeName(curr->ref->type.getHeapType());
  }